

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void flatbuffers::anon_unknown_0::DeserializeDoc
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *doc,Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((documentation != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) &&
     (*(int *)documentation != 0)) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      lVar1 = (ulong)uVar2 + 4;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 documentation + (ulong)*(uint *)(documentation + (ulong)uVar2 + 4) + lVar1 + 4,
                 documentation +
                 (ulong)*(uint *)(documentation +
                                 (ulong)*(uint *)(documentation + (ulong)uVar2 + 4) + lVar1) +
                 (ulong)*(uint *)(documentation + (ulong)uVar2 + 4) + lVar1 + 4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)doc,&local_50)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 4;
    } while (uVar3 < *(uint *)documentation);
  }
  return;
}

Assistant:

static void DeserializeDoc(std::vector<std::string> &doc,
                           const Vector<Offset<String>> *documentation) {
  if (documentation == nullptr) return;
  for (uoffset_t index = 0; index < documentation->size(); index++)
    doc.push_back(documentation->Get(index)->str());
}